

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O2

size_t __thiscall htmlcxx2::HTML::Node::parseAttributes(Node *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte bVar10;
  uint __c;
  byte *pbVar11;
  allocator<char> local_a1;
  Node *local_a0;
  string key;
  string val;
  size_t local_58;
  string local_50;
  
  if (this->kind_ == NODE_TAG) {
    if (this->attributesParsed_ == true) {
      lVar3 = (long)(this->attributeKeys_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->attributeKeys_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_001569a5:
      return lVar3 >> 5;
    }
    this->attributesParsed_ = true;
    pcVar4 = strchr((this->text_)._M_dataplus._M_p,0x3c);
    if (pcVar4 != (char *)0x0) {
      pbVar6 = (byte *)(pcVar4 + -2);
      local_a0 = this;
      do {
        bVar10 = pbVar6[3];
        iVar2 = isspace((uint)bVar10);
        pbVar6 = pbVar6 + 1;
      } while (iVar2 != 0);
      iVar2 = isalpha((uint)bVar10);
      if (iVar2 != 0) {
        do {
          bVar10 = pbVar6[2];
          iVar2 = isspace((uint)bVar10);
          pbVar6 = pbVar6 + 1;
          if (bVar10 == 0x3e) break;
        } while (iVar2 == 0);
        do {
          bVar10 = pbVar6[1];
          pbVar6 = pbVar6 + 1;
          iVar2 = isspace((uint)bVar10);
        } while (iVar2 != 0);
        while ((bVar10 != 0 && (bVar10 != 0x3e))) {
          key._M_dataplus._M_p = (pointer)&key.field_2;
          key._M_string_length = 0;
          val._M_dataplus._M_p = (pointer)&val.field_2;
          val._M_string_length = 0;
          key.field_2._M_local_buf[0] = '\0';
          val.field_2._M_local_buf[0] = '\0';
          pbVar7 = pbVar6 + -1;
          pbVar5 = pbVar6;
          while( true ) {
            pbVar5 = pbVar5 + 1;
            bVar10 = *pbVar6;
            if (bVar10 == 0) break;
            iVar2 = isalnum((uint)bVar10);
            if ((iVar2 != 0) || (iVar2 = isspace((uint)bVar10), iVar2 != 0)) break;
            pbVar6 = pbVar6 + 1;
            pbVar7 = pbVar7 + 1;
          }
          do {
            pbVar8 = pbVar7;
            pbVar11 = pbVar5;
            iVar2 = isspace((uint)pbVar8[1]);
            pbVar5 = pbVar11 + 1;
            pbVar7 = pbVar8 + 1;
            pbVar9 = pbVar8;
          } while (iVar2 != 0);
          do {
            do {
              pbVar7 = pbVar11;
              pbVar6 = pbVar9;
              pbVar9 = pbVar6 + 1;
              bVar10 = pbVar6[1];
              iVar2 = isalnum((uint)bVar10);
              pbVar11 = pbVar7 + 1;
            } while (bVar10 == 0x2d);
          } while (iVar2 != 0);
          std::__cxx11::string::assign<char_const*,void>
                    ((string *)&key,(char *)(pbVar8 + 1),(char *)pbVar9);
          do {
            pbVar5 = pbVar7;
            bVar10 = pbVar6[1];
            pbVar6 = pbVar6 + 1;
            iVar2 = isspace((uint)bVar10);
            pbVar7 = pbVar5 + 1;
          } while (iVar2 != 0);
          if (bVar10 == 0x3d) {
            do {
              pbVar9 = pbVar5;
              pbVar7 = pbVar6;
              bVar10 = pbVar7[1];
              pbVar6 = pbVar7 + 1;
              __c = (uint)bVar10;
              iVar2 = isspace(__c);
              pbVar5 = pbVar9 + 1;
            } while (iVar2 != 0);
            if ((bVar10 == 0x22) || (pbVar5 = pbVar6, __c == 0x27)) {
              pbVar7 = pbVar7 + 2;
              pbVar5 = (byte *)strchr((char *)pbVar7,__c);
              if (pbVar5 == (byte *)0x0) {
                pbVar11 = (byte *)strchr((char *)pbVar7,0x20);
                pbVar7 = (byte *)strchr((char *)pbVar7,0x3e);
                pbVar5 = pbVar7;
                if (pbVar11 < pbVar7) {
                  pbVar5 = pbVar11;
                }
                if (pbVar11 == (byte *)0x0) {
                  pbVar5 = pbVar7;
                }
                if (pbVar5 == (byte *)0x0) {
                  local_58 = (long)(local_a0->attributeKeys_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_a0->attributeKeys_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5;
                  bVar1 = false;
                  goto LAB_00156951;
                }
              }
              do {
                pbVar6 = pbVar9 + 1;
                pbVar9 = pbVar9 + 1;
                iVar2 = isspace((uint)*pbVar6);
                pbVar6 = pbVar5;
                if (pbVar5 <= pbVar9) break;
              } while (iVar2 != 0);
              do {
                pbVar7 = pbVar6;
                pbVar6 = pbVar7 + -1;
                iVar2 = isspace((uint)*pbVar6);
                if (pbVar6 < pbVar9) break;
              } while (iVar2 != 0);
              std::__cxx11::string::assign<char_const*,void>
                        ((string *)&val,(char *)pbVar9,(char *)pbVar7);
              pbVar6 = pbVar5 + 1;
            }
            else {
              while (((bVar10 != 0 && (iVar2 = isspace((uint)bVar10), bVar10 != 0x3e)) &&
                     (iVar2 == 0))) {
                bVar10 = pbVar5[1];
                pbVar5 = pbVar5 + 1;
              }
              std::__cxx11::string::assign<char_const*,void>
                        ((string *)&val,(char *)pbVar6,(char *)pbVar5);
              pbVar6 = pbVar5;
            }
            bVar1 = true;
            addAttribute(local_a0,&key,&val);
          }
          else {
            bVar1 = true;
            if (key._M_string_length != 0) {
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_a1);
              addAttribute(local_a0,&key,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
          }
LAB_00156951:
          std::__cxx11::string::~string((string *)&val);
          std::__cxx11::string::~string((string *)&key);
          if (!bVar1) {
            return local_58;
          }
          bVar10 = *pbVar6;
        }
        lVar3 = (long)(local_a0->attributeKeys_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_a0->attributeKeys_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_001569a5;
      }
    }
  }
  return 0;
}

Assistant:

bool isTag() const                     { return kind_ == NODE_TAG; }